

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_overlay(Integer g_a,Integer g_parent)

{
  char *pcVar1;
  short sVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  long lVar6;
  C_Integer *pCVar7;
  Integer IVar8;
  Integer IVar9;
  logical lVar10;
  Integer *pIVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  size_t __n;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  global_array_t *pgVar25;
  long lVar26;
  C_Integer CVar27;
  int _ndim;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long grp_id;
  long lVar31;
  long lVar32;
  bool bVar33;
  Integer _ndim_2;
  Integer hi [7];
  Integer dims [7];
  Integer chunk [7];
  Integer blk [7];
  Integer pe [7];
  Integer width [7];
  Integer local_218;
  ulong local_200;
  global_array_t *local_1f8;
  C_Integer *local_1f0;
  Integer local_1e8;
  long local_1e0;
  long local_1d8 [8];
  size_t local_198;
  int *local_190;
  Integer local_188 [7];
  C_Integer **local_150;
  long local_148;
  ulong local_140;
  Integer local_138;
  ulong local_130;
  undefined8 local_128;
  Integer local_e8 [8];
  Integer local_a8 [8];
  long local_68 [7];
  
  lVar13 = g_a + 1000;
  local_1e8 = GAme;
  local_218 = GAnproc;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  lVar29 = lVar13 * 0x368;
  if (GA[lVar13].ndim == -1) {
    pnga_error("Insufficient data to create global array",0);
  }
  iVar14 = GA[lVar13].p_handle;
  if (GA[lVar13].p_handle == GA_Init_Proc_Group) {
    GA[lVar13].p_handle = GA_Default_Proc_Group;
    iVar14 = GA_Default_Proc_Group;
  }
  grp_id = (long)iVar14;
  pnga_pgroup_sync(grp_id);
  local_148 = (g_parent + 1000) * 0x368;
  if (iVar14 != GA[g_parent + 1000].p_handle) {
    pnga_error("Parent and overlay global array must be on same procesor group",0);
  }
  if (0 < iVar14) {
    local_218 = (Integer)PGRP_LIST[grp_id].map_nproc;
    local_1e8 = (Integer)PGRP_LIST[grp_id].map_proc_list[GAme];
  }
  if (GAinitialized == '\0') {
    pnga_error("GA not initialized ",0);
  }
  if (ma_address_init == '\0') {
    gai_ma_address_init();
  }
  pgVar5 = GA;
  sVar2 = GA[lVar13].ndim;
  lVar28 = (long)sVar2;
  if (0 < lVar28) {
    memcpy(local_68,GA[g_a + 1000].width,lVar28 * 8);
  }
  uVar30 = local_140;
  pCVar7 = pgVar5[lVar13].mapc;
  if ((pCVar7 == (C_Integer *)0x0) && (pgVar5[lVar13].distr_type == 0)) {
    if (0 < sVar2) {
      lVar32 = 0;
      do {
        local_188[lVar32] = pgVar5[g_a + 1000].dims[lVar32];
        (&local_128)[lVar32] = pgVar5[g_a + 1000].chunk[lVar32];
        lVar32 = lVar32 + 1;
      } while (lVar28 != lVar32);
    }
    if (CONCAT44(local_128._4_4_,(undefined4)local_128) == 0) {
      if (0 < sVar2) {
        memset(local_e8,0xff,lVar28 * 8);
      }
    }
    else if (0 < sVar2) {
      lVar32 = 0;
      do {
        lVar12 = local_188[lVar32];
        if ((long)(&local_128)[lVar32] < local_188[lVar32]) {
          lVar12 = (&local_128)[lVar32];
        }
        local_e8[lVar32] = lVar12;
        lVar32 = lVar32 + 1;
      } while (lVar28 != lVar32);
    }
    if (0 < sVar2) {
      lVar32 = 0;
      do {
        if (local_188[lVar32] == 1) {
          local_e8[lVar32] = 1;
        }
        lVar32 = lVar32 + 1;
      } while (lVar28 != lVar32);
    }
    pnga_pgroup_sync(grp_id);
    if (iVar14 == 0) {
      lVar32 = (long)PGRP_LIST->map_nproc;
    }
    else {
      lVar32 = GA[lVar13].num_rstrctd;
      if (GA[lVar13].num_rstrctd == 0) {
        lVar32 = local_218;
      }
    }
    ddb_h2(lVar28,local_188,lVar32,0.0,0,local_e8,local_a8);
    if (0 < sVar2) {
      lVar32 = 0;
      pIVar11 = mapALL;
      do {
        lVar12 = (&local_128)[lVar32];
        lVar21 = local_188[lVar32];
        if (lVar12 < 2) {
          lVar21 = lVar21 - (local_e8[lVar32] + -1) * local_a8[lVar32];
        }
        else {
          lVar19 = lVar21;
          if (lVar12 < lVar21) {
            lVar19 = lVar12;
          }
          lVar21 = (lVar21 + -1) / lVar19 + (1 - local_e8[lVar32]) * local_a8[lVar32] + 1;
        }
        lVar19 = local_a8[lVar32];
        if ((lVar19 < 1) || (local_188[lVar32] < 1)) {
          lVar17 = 0;
        }
        else {
          lVar6 = 0;
          lVar18 = 0;
          do {
            lVar24 = local_e8[lVar32] - (ulong)(lVar21 <= lVar6);
            pIVar11[lVar6] = lVar18 + 1;
            if (1 < lVar12) {
              lVar19 = local_188[lVar32];
              if (lVar12 < local_188[lVar32]) {
                lVar19 = lVar12;
              }
              lVar24 = lVar24 * lVar19;
            }
            lVar17 = lVar6 + 1;
            lVar19 = local_a8[lVar32];
            if (lVar19 <= lVar17) break;
            lVar18 = lVar18 + lVar24;
            lVar6 = lVar6 + 1;
          } while (lVar18 < local_188[lVar32]);
        }
        if (lVar19 < lVar17) {
          lVar17 = lVar19;
        }
        local_a8[lVar32] = lVar17;
        pIVar11 = pIVar11 + lVar17;
        lVar32 = lVar32 + 1;
      } while (lVar32 != lVar28);
    }
    pgVar5 = GA;
    if (sVar2 < 1) {
      lVar32 = 0;
    }
    else {
      lVar12 = 0;
      lVar32 = 0;
      do {
        lVar21 = local_a8[lVar12];
        pgVar5[g_a + 1000].nblock[lVar12] = (int)lVar21;
        lVar32 = lVar32 + lVar21;
        lVar12 = lVar12 + 1;
      } while (lVar28 != lVar12);
    }
    pCVar7 = (C_Integer *)malloc(lVar32 * 8 + 8);
    GA[lVar13].mapc = pCVar7;
    pIVar11 = mapALL;
    if (0 < lVar32) {
      pCVar7 = GA[lVar13].mapc;
      lVar12 = 0;
      do {
        pCVar7[lVar12] = pIVar11[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar32 != lVar12);
    }
    GA[lVar13].mapc[lVar32] = -1;
    uVar30 = local_140;
switchD_00164b31_default:
    local_140 = uVar30;
    lVar32 = 0;
  }
  else {
    uVar16 = (ulong)(pgVar5[lVar13].distr_type - 1);
    local_140 = (ulong)(uint)pgVar5[lVar13].distr_type;
    switch(uVar16) {
    case 0:
      lVar12 = pgVar5[lVar13].block_total;
      if (GAme < lVar12) {
        local_150 = &pgVar5[lVar13].mapc;
        local_138 = GAnproc;
        uVar30 = (ulong)(uint)(int)sVar2;
        local_198 = uVar30 * 8;
        local_190 = pgVar5[g_a + 1000].nblock;
        pgVar25 = pgVar5 + g_a;
        lVar32 = 0;
        local_130 = uVar16;
        IVar9 = GAme;
        local_1f8 = pgVar25;
        local_1f0 = pCVar7;
        local_1e0 = lVar29;
        do {
          if ((uint)local_130 < 3) {
            uVar16 = (long)(int)IVar9 % pgVar5[lVar13].num_blocks[0];
            local_128._0_4_ = (int)uVar16;
            if (1 < sVar2) {
              uVar16 = uVar16 & 0xffffffff;
              lVar21 = 0;
              lVar29 = IVar9;
              do {
                lVar29 = (long)((int)lVar29 - (int)uVar16) / pgVar5[g_a + 1000].num_blocks[lVar21];
                uVar16 = (long)(int)lVar29 % pgVar5[g_a + 1000].num_blocks[lVar21 + 1];
                *(int *)((long)&local_128 + lVar21 * 4 + 4) = (int)uVar16;
                lVar21 = lVar21 + 1;
              } while (uVar30 - 1 != lVar21);
            }
            if (0 < sVar2) {
              lVar29 = 0;
              do {
                iVar15 = *(int *)((long)&local_128 + lVar29);
                lVar21 = *(long *)((long)pgVar5[g_a + 1000].block_dims + lVar29 * 2);
                *(long *)((long)local_188 + lVar29 * 2) = lVar21 * iVar15 + 1;
                lVar21 = ((long)iVar15 + 1) * lVar21;
                *(long *)((long)local_1d8 + lVar29 * 2) = lVar21;
                lVar19 = *(long *)((long)pgVar5[g_a + 1000].dims + lVar29 * 2);
                if (lVar19 <= lVar21) {
                  lVar21 = lVar19;
                }
                *(long *)((long)local_1d8 + lVar29 * 2) = lVar21;
                lVar29 = lVar29 + 4;
              } while (uVar30 << 2 != lVar29);
            }
          }
          else if ((int)local_140 == 4) {
            uVar16 = (long)(int)IVar9 % pgVar5[lVar13].num_blocks[0];
            local_128._0_4_ = (int)uVar16;
            if (1 < sVar2) {
              uVar16 = uVar16 & 0xffffffff;
              lVar21 = 0;
              lVar29 = IVar9;
              do {
                lVar29 = (long)((int)lVar29 - (int)uVar16) / pgVar5[g_a + 1000].num_blocks[lVar21];
                uVar16 = (long)(int)lVar29 % pgVar5[g_a + 1000].num_blocks[lVar21 + 1];
                *(int *)((long)&local_128 + lVar21 * 4 + 4) = (int)uVar16;
                lVar21 = lVar21 + 1;
              } while (uVar30 - 1 != lVar21);
            }
            if (0 < sVar2) {
              pCVar4 = *local_150;
              lVar29 = 0;
              iVar15 = 0;
              do {
                iVar3 = *(int *)((long)&local_128 + lVar29);
                lVar21 = (long)iVar15 + (long)iVar3;
                *(C_Integer *)((long)local_188 + lVar29 * 2) = pCVar4[lVar21];
                if ((long)iVar3 < *(long *)((long)pgVar5[lVar13].num_blocks + lVar29 * 2) + -1) {
                  lVar21 = pCVar7[lVar21 + 1] + -1;
                }
                else {
                  lVar21 = *(long *)((long)pgVar5[lVar13].dims + lVar29 * 2);
                }
                *(long *)((long)local_1d8 + lVar29 * 2) = lVar21;
                iVar15 = iVar15 + *(int *)((long)pgVar5[lVar13].num_blocks + lVar29 * 2);
                lVar29 = lVar29 + 4;
              } while (uVar30 << 2 != lVar29);
            }
          }
          else if ((int)local_140 == 0) {
            if (pgVar5[lVar13].num_rstrctd == 0) {
              lVar29 = 1;
              if (0 < sVar2) {
                lVar21 = 0;
                do {
                  lVar29 = lVar29 * local_190[lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar28 != lVar21);
              }
              if ((IVar9 < 0) || (lVar29 <= IVar9)) {
LAB_00164eaa:
                if (0 < sVar2) {
                  memset(local_188,0,lVar28 * 8);
                  __n = lVar28 * 8;
LAB_00164f04:
                  memset(local_1d8,0xff,__n);
                  pCVar7 = local_1f0;
                  pgVar25 = local_1f8;
                }
              }
              else if (0 < sVar2) {
                lVar21 = 0;
                lVar19 = 0;
                lVar29 = IVar9;
                do {
                  lVar6 = (long)pgVar25[1000].nblock[lVar21];
                  lVar17 = lVar29 % lVar6;
                  local_188[lVar21] = pCVar7[lVar17 + lVar19];
                  if (lVar17 == lVar6 + -1) {
                    CVar27 = pgVar25[1000].dims[lVar21];
                  }
                  else {
                    CVar27 = pCVar7[lVar17 + lVar19 + 1] + -1;
                  }
                  lVar19 = lVar19 + lVar6;
                  local_1d8[lVar21] = CVar27;
                  lVar21 = lVar21 + 1;
                  lVar29 = lVar29 / lVar6;
                } while (lVar28 != lVar21);
              }
            }
            else if (IVar9 < pgVar5[lVar13].num_rstrctd) {
              lVar29 = 1;
              if (0 < sVar2) {
                lVar21 = 0;
                do {
                  lVar29 = lVar29 * local_190[lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar28 != lVar21);
              }
              if ((IVar9 < 0) || (lVar29 <= IVar9)) goto LAB_00164eaa;
              if (0 < sVar2) {
                lVar21 = 0;
                lVar19 = 0;
                lVar29 = IVar9;
                do {
                  lVar6 = (long)pgVar25[1000].nblock[lVar19];
                  lVar17 = lVar29 % lVar6;
                  local_188[lVar19] = pCVar7[lVar17 + lVar21];
                  if (lVar17 == lVar6 + -1) {
                    CVar27 = pgVar25[1000].dims[lVar19];
                  }
                  else {
                    CVar27 = pCVar7[lVar17 + lVar21 + 1] + -1;
                  }
                  lVar21 = lVar21 + lVar6;
                  local_1d8[lVar19] = CVar27;
                  lVar19 = lVar19 + 1;
                  lVar29 = lVar29 / lVar6;
                } while (lVar28 != lVar19);
              }
            }
            else if (0 < sVar2) {
              memset(local_188,0,local_198);
              __n = local_198;
              goto LAB_00164f04;
            }
          }
          lVar29 = 1;
          if (0 < sVar2) {
            lVar21 = 0;
            do {
              lVar29 = lVar29 * ((local_1d8[lVar21] - local_188[lVar21]) + 1);
              lVar21 = lVar21 + 1;
            } while (lVar28 != lVar21);
          }
          lVar32 = lVar32 + lVar29;
          IVar9 = IVar9 + local_138;
          lVar29 = local_1e0;
        } while (IVar9 < lVar12);
      }
      else {
        lVar32 = 0;
        local_1e0 = lVar29;
      }
      break;
    case 1:
      lVar32 = GAme % (long)pgVar5[lVar13].nblock[0];
      local_1d8[0] = lVar32;
      if (1 < sVar2) {
        lVar12 = 0;
        IVar9 = GAme;
        do {
          IVar9 = (IVar9 - lVar32) / (long)pgVar5[g_a + 1000].nblock[lVar12];
          lVar32 = IVar9 % (long)pgVar5[g_a + 1000].nblock[lVar12 + 1];
          local_1d8[lVar12 + 1] = lVar32;
          lVar12 = lVar12 + 1;
        } while (lVar28 + -1 != lVar12);
      }
      lVar32 = 1;
      local_1e0 = lVar29;
      if (0 < sVar2) {
        lVar12 = 0;
        do {
          lVar21 = local_1d8[lVar12];
          if (lVar21 < pgVar5[lVar13].num_blocks[lVar12]) {
            lVar22 = (long)pgVar5[lVar13].nblock[lVar12];
            lVar17 = pgVar5[lVar13].dims[lVar12];
            lVar6 = pgVar5[lVar13].block_dims[lVar12];
            lVar26 = lVar6 * (lVar21 + 1);
            lVar19 = ((lVar21 + 1) - lVar22) * lVar6;
            lVar24 = lVar6 * lVar22;
            lVar20 = (lVar22 - lVar21) * lVar6;
            lVar18 = 0;
            do {
              lVar31 = lVar18;
              lVar23 = lVar6 * lVar21;
              lVar18 = lVar17;
              if (lVar26 < lVar17) {
                lVar18 = lVar26;
              }
              lVar21 = lVar21 + lVar22;
              lVar19 = lVar19 + lVar24;
              lVar20 = lVar20 - lVar24;
              lVar26 = lVar26 + lVar24;
              lVar18 = (lVar31 - lVar23) + lVar18;
            } while (lVar21 < pgVar5[lVar13].num_blocks[lVar12]);
            if (lVar17 < lVar19) {
              lVar19 = lVar17;
            }
            lVar19 = lVar20 + lVar31 + lVar19;
          }
          else {
            lVar19 = 0;
          }
          lVar32 = lVar32 * lVar19;
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar28);
      }
      break;
    case 2:
      lVar32 = GAme % (long)pgVar5[lVar13].nblock[0];
      local_1d8[0] = lVar32;
      if (1 < sVar2) {
        lVar12 = 0;
        IVar9 = GAme;
        do {
          IVar9 = (IVar9 - lVar32) / (long)pgVar5[g_a + 1000].nblock[lVar12];
          lVar32 = IVar9 % (long)pgVar5[g_a + 1000].nblock[lVar12 + 1];
          local_1d8[lVar12 + 1] = lVar32;
          lVar12 = lVar12 + 1;
        } while (lVar28 + -1 != lVar12);
      }
      lVar32 = 1;
      local_1e0 = lVar29;
      if (0 < sVar2) {
        lVar12 = 0;
        do {
          lVar21 = local_1d8[lVar12];
          if (lVar21 < pgVar5[lVar13].num_blocks[lVar12]) {
            lVar22 = (long)pgVar5[lVar13].nblock[lVar12];
            lVar17 = pgVar5[lVar13].dims[lVar12];
            lVar6 = pgVar5[lVar13].block_dims[lVar12];
            lVar26 = lVar6 * (lVar21 + 1);
            lVar19 = ((lVar21 + 1) - lVar22) * lVar6;
            lVar24 = lVar6 * lVar22;
            lVar20 = (lVar22 - lVar21) * lVar6;
            lVar18 = 0;
            do {
              lVar23 = lVar18;
              lVar31 = lVar6 * lVar21;
              lVar18 = lVar17;
              if (lVar26 < lVar17) {
                lVar18 = lVar26;
              }
              lVar21 = lVar21 + lVar22;
              lVar19 = lVar19 + lVar24;
              lVar20 = lVar20 - lVar24;
              lVar26 = lVar26 + lVar24;
              lVar18 = (lVar23 - lVar31) + lVar18;
            } while (lVar21 < pgVar5[lVar13].num_blocks[lVar12]);
            if (lVar17 < lVar19) {
              lVar19 = lVar17;
            }
            lVar19 = lVar20 + lVar23 + lVar19;
          }
          else {
            lVar19 = 0;
          }
          lVar32 = lVar32 * lVar19;
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar28);
      }
      break;
    case 3:
      lVar32 = GAme % (long)pgVar5[lVar13].nblock[0];
      local_1d8[0] = lVar32;
      if (1 < sVar2) {
        lVar12 = 0;
        IVar9 = GAme;
        do {
          IVar9 = (IVar9 - lVar32) / (long)pgVar5[g_a + 1000].nblock[lVar12];
          lVar32 = IVar9 % (long)pgVar5[g_a + 1000].nblock[lVar12 + 1];
          local_1d8[lVar12 + 1] = lVar32;
          lVar12 = lVar12 + 1;
        } while (lVar28 + -1 != lVar12);
      }
      if (sVar2 < 1) {
        lVar32 = 1;
        local_1e0 = lVar29;
      }
      else {
        lVar32 = 1;
        lVar12 = 0;
        lVar21 = 0;
        do {
          lVar19 = local_1d8[lVar21];
          lVar17 = pgVar5[lVar13].num_blocks[lVar21];
          if (lVar19 < lVar17) {
            lVar6 = 0;
            do {
              if (lVar19 < lVar17 + -1) {
                CVar27 = pCVar7[lVar12 + lVar19 + 1] + -1;
              }
              else {
                CVar27 = pgVar5[lVar13].dims[lVar21];
              }
              lVar6 = (lVar6 - pCVar7[lVar12 + lVar19]) + CVar27 + 1;
              lVar19 = lVar19 + pgVar5[lVar13].nblock[lVar21];
            } while (lVar19 < lVar17);
          }
          else {
            lVar6 = 0;
          }
          lVar32 = lVar32 * lVar6;
          lVar12 = lVar12 + lVar17;
          lVar21 = lVar21 + 1;
          local_1e0 = lVar29;
        } while (lVar21 != lVar28);
      }
      break;
    default:
      goto switchD_00164b31_default;
    }
  }
  GAstat.numcre = GAstat.numcre + 1;
  *(undefined4 *)((long)GA->dims + lVar29 + -0x28) = 1;
  IVar8 = pnga_cluster_nnodes();
  IVar9 = local_1e8;
  if ((IVar8 == 1) && (*(int *)((long)GA->block_dims + lVar29 + -0x18) == 0)) {
    *(undefined4 *)((long)GA->block_dims + lVar29 + -0x18) = 0xffffffff;
  }
  pgVar5 = GA;
  if (*(int *)((long)GA->block_dims + lVar29 + -4) == 0) {
    if (sVar2 < 1) {
      lVar10 = 0;
    }
    else {
      lVar10 = 0;
      do {
        pgVar5[g_a + 1000].scale[lVar10] =
             (double)pgVar5[g_a + 1000].nblock[lVar10] / (double)pgVar5[g_a + 1000].dims[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar28 != lVar10);
    }
    pnga_set_ghost_corner_flag(g_a,lVar10);
    if (iVar14 == 0) {
      IVar9 = (Integer)PGRP_LIST->map_proc_list[GAme];
    }
    pnga_distribution(g_a,IVar9,(Integer *)((long)GA->lo + lVar29),local_1d8);
    if ((*(long *)((long)GA->old_nblock + lVar29 + -0x30) == 0) ||
       (*(long *)((long)GA->old_nblock + lVar29 + -0x28) == 1)) {
      if (sVar2 < 1) {
        lVar32 = 1;
      }
      else {
        lVar32 = 1;
        lVar13 = 0;
        do {
          lVar32 = lVar32 * ((local_1d8[lVar13] - GA[g_a + 1000].lo[lVar13]) + local_68[lVar13] * 2
                            + 1);
          lVar13 = lVar13 + 1;
        } while (lVar28 != lVar13);
      }
    }
    else {
      lVar32 = 0;
    }
    lVar32 = *(int *)((long)GA->dims + lVar29 + -0x18) * lVar32;
  }
  else {
    lVar32 = lVar32 * *(int *)((long)GA->dims + lVar29 + -0x18);
    if (0 < sVar2) {
      lVar13 = 0;
      do {
        *(double *)((long)pgVar5->scale + lVar13 * 8 + lVar29) =
             (double)*(long *)((long)pgVar5->num_blocks + lVar13 * 8 + lVar29) /
             (double)*(long *)((long)pgVar5->dims + lVar13 * 8 + lVar29);
        lVar13 = lVar13 + 1;
      } while (lVar28 != lVar13);
    }
  }
  lVar13 = local_148;
  pgVar5 = GA;
  *(undefined8 *)((long)GA->dims + lVar29 + -8) = 0xffffffffffffffff;
  *(long *)((long)pgVar5->dims + lVar29 + -0x20) = lVar32;
  local_200 = (ulong)(lVar32 <= *(long *)((long)pgVar5->dims + local_148 + -0x20));
  IVar9 = pnga_type_f2c(0x3f2);
  if (iVar14 < 1) {
    pnga_gop(IVar9,&local_200,1,"&&");
  }
  else {
    pnga_pgroup_gop(grp_id,IVar9,&local_200,1,"&&");
  }
  pgVar5 = GA;
  if (local_200 != 0) {
    pcVar1 = GA->mem_dev + lVar29 + 0x20;
    pcVar1[0] = '\x01';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(undefined8 *)((long)pgVar5->dims + lVar29 + -8) =
         *(undefined8 *)((long)pgVar5->dims + lVar13 + -8);
    if (0 < local_218) {
      lVar28 = 0;
      do {
        *(undefined8 *)(*(long *)(GA->name + lVar29 + -0x10) + lVar28 * 8) =
             *(undefined8 *)(*(long *)(GA->name + lVar13 + -0x10) + lVar28 * 8);
        lVar28 = lVar28 + 1;
      } while (local_218 != lVar28);
    }
  }
  if (((*(int *)((long)GA->block_dims + lVar29 + -4) == 0) &&
      (*(int *)((long)GA->dims + lVar29 + -0x14) == 1)) &&
     (lVar10 = pnga_set_ghost_info(g_a), lVar10 == 0)) {
    pnga_error("Could not allocate update information for ghost cells",0);
  }
  pnga_pgroup_sync(grp_id);
  bVar33 = local_200 != 0;
  if (!bVar33) {
    pnga_destroy(g_a);
  }
  return (ulong)bVar33;
}

Assistant:

logical pnga_overlay(Integer g_a, Integer g_parent)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer g_p = g_parent + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);
  if (p_handle != (Integer)GA[g_p].p_handle) {
    pnga_error("Parent and overlay global array must be on same procesor group",0);
  }

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* check if everybody has enough memory to fit overlay GA */
  status = (GA[ga_handle].size <= GA[g_p].size) ? 1 : 0;
  if (p_handle > 0) {
    pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  } else {
    pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  }

  if (status) {
    GA[ga_handle].overlay = 1;
    GA[ga_handle].id = GA[g_p].id;
    for (i=0; i<grp_nproc; i++) {
      GA[ga_handle].ptr[i] = GA[g_p].ptr[i];
    }
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    status = TRUE;
  } else {
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}